

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextBuffer::appendv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int i;
  int iVar1;
  int new_size;
  value_type_conflict3 *pvVar2;
  int local_54;
  int double_capacity;
  int needed_sz;
  int write_off;
  int len;
  va_list args_copy;
  __va_list_tag *args_local;
  char *fmt_local;
  ImGuiTextBuffer *this_local;
  
  args_copy[0].overflow_arg_area = args->reg_save_area;
  write_off = args->gp_offset;
  unique0x100000a1 = args->fp_offset;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  args_copy[0].reg_save_area = args;
  iVar1 = vsnprintf((char *)0x0,0,fmt,args);
  if (0 < iVar1) {
    i = (this->Buf).Size;
    new_size = i + iVar1;
    if ((this->Buf).Capacity <= i + iVar1) {
      local_54 = (this->Buf).Capacity << 1;
      if (local_54 < new_size) {
        local_54 = new_size;
      }
      ImVector<char>::reserve(&this->Buf,local_54);
    }
    ImVector<char>::resize(&this->Buf,new_size);
    pvVar2 = ImVector<char>::operator[](&this->Buf,i);
    ImFormatStringV(pvVar2 + -1,iVar1 + 1,fmt,(__va_list_tag *)&write_off);
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = vsnprintf(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
        return;

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off] - 1, len+1, fmt, args_copy);
}